

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

double __thiscall
duckdb::Interpolator<false>::Extract<signed_char,double>
          (Interpolator<false> *this,char *dest,Vector *result)

{
  idx_t iVar1;
  idx_t iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = this->CRN;
  iVar2 = this->FRN;
  dVar3 = Cast::Operation<signed_char,double>(*dest);
  if (iVar1 != iVar2) {
    dVar4 = Cast::Operation<signed_char,double>(dest[1]);
    dVar5 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    dVar3 = dVar4 * dVar5 + dVar3 * (1.0 - dVar5);
  }
  return dVar3;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}